

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

void calc_mean_and_sd_weighted<float,std::vector<double,std::allocator<double>>,double>
               (size_t *ix_arr,size_t st,size_t end,float *x,
               vector<double,_std::allocator<double>_> *w,MissingAction missing_action,double *x_sd,
               double *x_mean)

{
  double __x;
  pointer pdVar1;
  double dVar2;
  double dVar3;
  size_t row;
  double __z;
  double dVar4;
  double dVar5;
  
  do {
    dVar2 = (double)x[ix_arr[st]];
    if (NAN(x[ix_arr[st]])) {
      if (end < st) {
LAB_00267fff:
        if (end < st) {
          dVar4 = NAN;
          __z = 0.0;
        }
        else {
          pdVar1 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar4 = 0.0;
          __z = 0.0;
          dVar5 = 0.0;
          do {
            dVar3 = (double)x[ix_arr[st]];
            if ((!NAN(x[ix_arr[st]])) && (ABS(dVar3) != INFINITY)) {
              __x = pdVar1[ix_arr[st]];
              dVar5 = dVar5 + __x;
              __z = fma(__x,(dVar3 - __z) / dVar5,__z);
              dVar4 = fma(__x,(dVar3 - dVar2) * (dVar3 - __z),dVar4);
              dVar2 = __z;
            }
            st = st + 1;
          } while (st <= end);
          dVar4 = dVar4 / dVar5;
        }
        *x_mean = __z;
        *x_sd = SQRT(dVar4);
        return;
      }
    }
    else if ((end < st) || (ABS(dVar2) != INFINITY)) goto LAB_00267fff;
    st = st + 1;
  } while( true );
}

Assistant:

void calc_mean_and_sd_weighted(size_t ix_arr[], size_t st, size_t end, real_t_ *restrict x, mapping &restrict w,
                               MissingAction missing_action, double &restrict x_sd, double &restrict x_mean)
{
    ldouble_safe cnt = 0;
    ldouble_safe w_this;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = x[ix_arr[st]];
    ldouble_safe xval;
    while (is_na_or_inf(m_prev) && st <= end)
    {
        m_prev = x[ix_arr[++st]];
    }

    for (size_t row = st; row <= end; row++)
    {
        xval = x[ix_arr[row]];
        if (likely(!is_na_or_inf(xval)))
        {
            w_this = w[ix_arr[row]];
            cnt += w_this;
            m = std::fma(w_this, (xval - m) / cnt, m);
            s = std::fma(w_this, (xval - m) * (xval - m_prev), s);
            m_prev = m;
        }
    }

    x_mean = m;
    x_sd   = std::sqrt((ldouble_safe)s / (ldouble_safe)cnt);
}